

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderVkImpl::GetBytecode(ShaderVkImpl *this,void **ppBytecode,Uint64 *Size)

{
  pointer puVar1;
  pointer puVar2;
  string msg;
  string local_40;
  
  if ((this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i < SHADER_STATUS_READY) {
    FormatString<char[108]>
              (&local_40,
               (char (*) [108])
               "Shader byte code is not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetBytecode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderVkImpl.hpp"
               ,0x6c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  puVar1 = (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pointer)0x0;
  if (puVar1 != (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    puVar2 = puVar1;
  }
  *ppBytecode = puVar2;
  *Size = (long)(this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

GetBytecode(const void** ppBytecode,
                                                Uint64&      Size) const override final
    {
        DEV_CHECK_ERR(!IsCompiling(), "Shader byte code is not available until the shader is compiled. Use GetStatus() to check the shader status.");
        *ppBytecode = !m_SPIRV.empty() ? m_SPIRV.data() : nullptr;
        Size        = m_SPIRV.size() * sizeof(m_SPIRV[0]);
    }